

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.c
# Opt level: O0

void conv_fft(conv_object obj,double *inp1,double *inp2,double *oup)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double *inp;
  double *inp_00;
  fft_data *inp_01;
  fft_data *oup_00;
  fft_data *oup_01;
  double *oup_02;
  double *co;
  fft_data *bo;
  fft_data *ao;
  fft_data *c;
  double *b;
  double *a;
  int ls;
  int L2;
  int L1;
  int N;
  int i;
  double *oup_local;
  double *inp2_local;
  double *inp1_local;
  conv_object obj_local;
  
  iVar1 = obj->clen;
  iVar2 = obj->ilen1;
  iVar3 = obj->ilen2;
  inp = (double *)malloc((long)iVar1 << 4);
  inp_00 = (double *)malloc((long)iVar1 << 4);
  inp_01 = (fft_data *)malloc((long)iVar1 << 4);
  oup_00 = (fft_data *)malloc((long)iVar1 << 4);
  oup_01 = (fft_data *)malloc((long)iVar1 << 4);
  oup_02 = (double *)malloc((long)iVar1 << 4);
  for (L1 = 0; L1 < iVar1; L1 = L1 + 1) {
    if (L1 < iVar2) {
      inp[L1] = inp1[L1];
    }
    else {
      inp[L1] = 0.0;
    }
    if (L1 < iVar3) {
      inp_00[L1] = inp2[L1];
    }
    else {
      inp_00[L1] = 0.0;
    }
  }
  fft_r2c_exec(obj->fobj,inp,oup_00);
  fft_r2c_exec(obj->fobj,inp_00,oup_01);
  for (L1 = 0; L1 < iVar1; L1 = L1 + 1) {
    inp_01[L1].re = oup_00[L1].re * oup_01[L1].re + -(oup_00[L1].im * oup_01[L1].im);
    inp_01[L1].im = oup_00[L1].im * oup_01[L1].re + oup_00[L1].re * oup_01[L1].im;
  }
  fft_c2r_exec(obj->iobj,inp_01,oup_02);
  for (L1 = 0; L1 < iVar2 + iVar3 + -1; L1 = L1 + 1) {
    oup[L1] = oup_02[L1] / (double)iVar1;
  }
  free(inp);
  free(inp_00);
  free(inp_01);
  free(oup_00);
  free(oup_01);
  free(oup_02);
  return;
}

Assistant:

void conv_fft(const conv_object obj,fft_type *inp1,fft_type *inp2,fft_type *oup) {
	int i,N,L1,L2,ls;
	fft_type* a;
	fft_type* b;
	fft_data* c;
	fft_data* ao;
	fft_data* bo;
	fft_type* co;
	
	N = obj->clen;
	L1 = obj->ilen1;
	L2 = obj->ilen2;
	ls = L1 + L2 - 1;
	
	a = (fft_type*) malloc (sizeof(fft_data) * N);
	b = (fft_type*) malloc (sizeof(fft_data) * N);
	c = (fft_data*) malloc (sizeof(fft_data) * N);
	ao = (fft_data*) malloc (sizeof(fft_data) * N);
	bo = (fft_data*) malloc (sizeof(fft_data) * N);
	co = (fft_type*) malloc (sizeof(fft_data) * N);
	
	for (i = 0; i < N;i++) {
		if (i < L1) {
			a[i] = inp1[i];
		} else {
			a[i] = 0.0;
		}
		
		if (i < L2) {
			b[i] = inp2[i];
		} else {
			b[i] = 0.0;
		}
	
	}
	
	fft_r2c_exec(obj->fobj,a,ao);
	fft_r2c_exec(obj->fobj,b,bo);
	
	for (i = 0; i < N;i++) {
		c[i].re = ao[i].re * bo[i].re - ao[i].im * bo[i].im;
		c[i].im = ao[i].im * bo[i].re + ao[i].re * bo[i].im;
	}
	
	fft_c2r_exec(obj->iobj,c,co);
	
	for (i = 0; i < ls;i++) {
		oup[i] = co[i]/N;
	}
	
	free(a);
	free(b);
	free(c);
	free(ao);
	free(bo);
	free(co);
	
	
}